

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValueOfArrayType
          (AsciiParser *this,uint32_t type_id,Value *result)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  size_type *psVar6;
  uint32_t tyid;
  uint32_t extraout_EDX;
  uint32_t tyid_00;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t tyid_01;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t tyid_02;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t tyid_03;
  value *this_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> typed_val;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  vector<double,_std::allocator<double>_> local_218;
  string local_1f8;
  string local_1d8;
  storage_union local_1b8;
  undefined8 *local_1a8;
  storage_union local_1a0;
  undefined1 *local_190;
  ios_base local_130 [264];
  
  if (result == (Value *)0x0) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    local_190 = linb::any::vtable_for_type<tinyusdz::value::ValueBlock>()::table;
    linb::any::swap((any *)&local_1a0,&result->v_);
    if (local_190 != (undefined1 *)0x0) {
      (**(code **)(local_190 + 0x20))(&local_1a0);
    }
    return true;
  }
  local_1a8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1b8.dynamic = (void *)0x0;
  switch(type_id) {
  case 6:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::Token>
                      (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218)
    ;
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)0x6,tyid_01);
      plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x3b3588);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_1f8.field_2._M_allocated_capacity = *psVar5;
        local_1f8.field_2._8_8_ = plVar4[3];
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar5;
        local_1f8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1f8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_238.field_2._M_allocated_capacity = *psVar6;
        local_238.field_2._8_8_ = plVar4[3];
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar6;
        local_238._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_238._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,local_238._M_dataplus._M_p,
                          local_238._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      ::std::ios_base::~ios_base(local_130);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218);
      goto LAB_00393ae7;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>()::
                table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218);
    local_1a0.dynamic = pvVar2;
    linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
    if (local_190 != (undefined1 *)0x0) {
      (**(code **)(local_190 + 0x20))(&local_1a0);
    }
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218);
    goto LAB_00393751;
  case 7:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::__cxx11::string>
                      (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_218);
    if (bVar1) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>()
                  ::table;
      pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pvVar2,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_218);
      local_1a0.dynamic = pvVar2;
      linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
      if (local_190 != (undefined1 *)0x0) {
        (**(code **)(local_190 + 0x20))(&local_1a0);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_218);
      goto LAB_00393751;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
               ,0x68);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)0x7,tyid_02);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                    );
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238.field_2._8_8_ = plVar4[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_238._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_218);
    goto LAB_00393ae7;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
               ,0x68);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xcb);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1f8,(value *)(ulong)type_id,tyid);
    ::std::operator+(&local_238," : TODO: timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                    );
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    goto LAB_00393ae7;
  case 0xe:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                      (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                            )&local_218);
    if (bVar1) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>()
                  ::table;
      pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)pvVar2,
                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&local_218
                );
      break;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
               ,0x68);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xad);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    this_00 = (value *)0xe;
    tyid_03 = extraout_EDX_14;
LAB_003935f8:
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,this_00,tyid_03);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                    );
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238.field_2._8_8_ = plVar4[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_238._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    goto LAB_00393731;
  case 0xf:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0xf;
      tyid_03 = extraout_EDX_18;
      goto LAB_003935f8;
    }
    local_190 = linb::any::vtable_for_type<std::vector<int,std::allocator<int>>>()::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)pvVar2,
               (vector<int,_std::allocator<int>_> *)&local_218);
    break;
  case 0x10:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xab);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x10;
      tyid_03 = extraout_EDX_15;
      goto LAB_003935f8;
    }
    local_190 = linb::any::vtable_for_type<std::vector<long,std::allocator<long>>>()::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)pvVar2,
               (vector<long,_std::allocator<long>_> *)&local_218);
    break;
  case 0x11:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xae);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x11;
      tyid_03 = extraout_EDX_17;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::
    vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              *)pvVar2,
             (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              *)&local_218);
    break;
  case 0x12:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xaf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x12;
      tyid_03 = extraout_EDX_22;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::
    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)pvVar2,
             (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)&local_218);
    break;
  case 0x13:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x13;
      tyid_03 = extraout_EDX_23;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::
    vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              *)pvVar2,
             (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              *)&local_218);
    break;
  case 0x1b:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<unsigned_int>
                      (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xaa);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x1b;
      tyid_03 = extraout_EDX_05;
      goto LAB_003935f8;
    }
    local_190 = linb::any::vtable_for_type<std::vector<unsigned_int,std::allocator<unsigned_int>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar2,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_218);
    break;
  case 0x1c:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<unsigned_long>
                      (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xac);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x1c;
      tyid_03 = extraout_EDX_25;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<unsigned_long,std::allocator<unsigned_long>>>()::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pvVar2,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218);
    break;
  case 0x28:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x28;
      tyid_03 = extraout_EDX_07;
      goto LAB_003935f8;
    }
    local_190 = linb::any::vtable_for_type<std::vector<float,std::allocator<float>>>()::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)pvVar2,
               (vector<float,_std::allocator<float>_> *)&local_218);
    break;
  case 0x29:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<float,2ul>>
                      (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb2);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x29;
      tyid_03 = extraout_EDX_16;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
              ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)pvVar2,
               (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
               &local_218);
    break;
  case 0x2a:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<float,3ul>>
                      (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x2a;
      tyid_03 = extraout_EDX_10;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)pvVar2,
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
               &local_218);
    break;
  case 0x2b:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<float,4ul>>
                      (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb4);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x2b;
      tyid_03 = extraout_EDX_02;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
              ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)pvVar2,
               (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
               &local_218);
    break;
  case 0x2c:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<double>(this,&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x2c;
      tyid_03 = extraout_EDX_20;
      goto LAB_003935f8;
    }
    local_190 = linb::any::vtable_for_type<std::vector<double,std::allocator<double>>>()::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<double,_std::allocator<double>_>::vector(pvVar2,&local_218);
    break;
  case 0x2d:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<double,2ul>>
                      (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x2d;
      tyid_03 = extraout_EDX_21;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)pvVar2,
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               &local_218);
    break;
  case 0x2e:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<double,3ul>>
                      (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x2e;
      tyid_03 = extraout_EDX_28;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)pvVar2,
               (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               &local_218);
    break;
  case 0x2f:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<double,4ul>>
                      (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x2f;
      tyid_03 = extraout_EDX_26;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
              ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)pvVar2,
               (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
               &local_218);
    break;
  case 0x30:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::quath>
                      (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xb9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x30;
      tyid_03 = extraout_EDX_00;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
              ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)pvVar2,
               (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)&local_218
              );
    break;
  case 0x31:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::quatf>
                      (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xba);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x31;
      tyid_03 = extraout_EDX_11;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
              ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)pvVar2,
               (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)&local_218
              );
    break;
  case 0x32:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::quatd>
                      (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xbb);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x32;
      tyid_03 = extraout_EDX_29;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
              ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)pvVar2,
               (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)&local_218
              );
    break;
  case 0x33:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                      (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x33;
      tyid_03 = extraout_EDX_01;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::vector
              ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
               pvVar2,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                       *)&local_218);
    break;
  case 0x34:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                      (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x34;
      tyid_03 = extraout_EDX_09;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::vector
              ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
               pvVar2,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                       *)&local_218);
    break;
  case 0x35:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                      (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,199);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x35;
      tyid_03 = extraout_EDX_06;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::vector
              ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
               pvVar2,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                       *)&local_218);
    break;
  case 0x36:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                      (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,200);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x36;
      tyid_03 = extraout_EDX_19;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::vector
              ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
               pvVar2,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                       *)&local_218);
    break;
  case 0x37:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                      (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x37;
      tyid_03 = extraout_EDX_03;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::vector
              ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
               pvVar2,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       *)&local_218);
    break;
  case 0x38:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                      (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xca);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x38;
      tyid_03 = extraout_EDX_31;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
              ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
               pvVar2,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)&local_218);
    break;
  case 0x3a:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color3f>
                      (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xbc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x3a;
      tyid_03 = extraout_EDX_30;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
              ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)pvVar2
               ,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                &local_218);
    break;
  case 0x3b:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color3d>
                      (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xbe);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x3b;
      tyid_03 = extraout_EDX_08;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::vector
              ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)pvVar2
               ,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                &local_218);
    break;
  case 0x3d:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color4f>
                      (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xbd);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x3d;
      tyid_03 = extraout_EDX_12;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::vector
              ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)pvVar2
               ,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                &local_218);
    break;
  case 0x3e:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color4d>
                      (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xbf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)&DAT_0000003e;
      tyid_03 = extraout_EDX_24;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::vector
              ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)pvVar2
               ,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                &local_218);
    break;
  case 0x40:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::point3f>
                      (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc2);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)&DAT_00000040;
      tyid_03 = extraout_EDX_13;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
              ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)pvVar2
               ,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                &local_218);
    break;
  case 0x43:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                      (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x43;
      tyid_03 = extraout_EDX;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
              ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
               pvVar2,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&local_218);
    break;
  case 0x46:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                      (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x46;
      tyid_03 = extraout_EDX_04;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::vector
              ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
               pvVar2,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)&local_218);
    break;
  case 0x4a:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                      (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x4a;
      tyid_03 = extraout_EDX_27;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::vector
              ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               pvVar2,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&local_218);
    break;
  case 0x4d:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                      (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                             *)&local_218);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xc4);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      this_00 = (value *)0x4d;
      tyid_03 = extraout_EDX_32;
      goto LAB_003935f8;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>()
                ::table;
    pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::vector
              ((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
               pvVar2,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&local_218);
    break;
  case 0x51:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                      (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                             *)&local_218);
    if (bVar1) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>()
                  ::table;
      pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::vector
                ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                 pvVar2,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         *)&local_218);
      local_1a0.dynamic = pvVar2;
      linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
      if (local_190 != (undefined1 *)0x0) {
        (**(code **)(local_190 + 0x20))(&local_1a0);
      }
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              &local_218);
      goto LAB_00393751;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
               ,0x68);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)0x51,tyid_00);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x3b3588);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1f8.field_2._M_allocated_capacity = *psVar5;
      local_1f8.field_2._8_8_ = plVar4[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar5;
      local_1f8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238.field_2._8_8_ = plVar4[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_238._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::~vector
              ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
               &local_218);
    goto LAB_00393ae7;
  }
  local_1a0.dynamic = pvVar2;
  linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
  if (local_190 != (undefined1 *)0x0) {
    (**(code **)(local_190 + 0x20))(&local_1a0);
  }
LAB_00393731:
  if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar1 == false) {
LAB_00393ae7:
    bVar1 = false;
  }
  else {
LAB_00393751:
    linb::any::operator=(&result->v_,(any *)&local_1b8);
    bVar1 = true;
  }
  if (local_1a8 != (undefined8 *)0x0) {
    (*(code *)local_1a8[4])(&local_1b8);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseTimeSampleValueOfArrayType(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    std::vector<__type> typed_val; \
    if (!ParseBasicTypeArray(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "[]`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;

}